

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

ImVec2 __thiscall
ImFont::CalcTextSizeA
          (ImFont *this,float size,float max_width,float wrap_width,char *text_begin,char *text_end,
          char **remaining)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  ulong uVar5;
  float *pfVar6;
  char *pcVar7;
  float fVar8;
  float fVar9;
  ImVec2 IVar10;
  uint c;
  uint local_64;
  float local_60;
  float local_5c;
  float local_58;
  uint uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  float local_48;
  float fStack_44;
  uint uStack_40;
  float fStack_3c;
  char **local_38;
  
  local_5c = max_width;
  if (text_end == (char *)0x0) {
    sVar3 = strlen(text_begin);
    text_end = text_begin + sVar3;
  }
  local_38 = remaining;
  if (text_begin < text_end) {
    local_60 = size / this->FontSize;
    local_48 = 0.0;
    uStack_40 = 0;
    fStack_3c = 0.0;
    pcVar4 = (char *)0x0;
    local_58 = 0.0;
    uStack_54 = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    fStack_44 = 0.0;
    do {
      if (wrap_width <= 0.0) {
LAB_0021066b:
        local_64 = (uint)*text_begin;
        if (*text_begin < '\0') {
          iVar2 = ImTextCharFromUtf8(&local_64,text_begin,text_end);
          pcVar7 = text_begin + iVar2;
          if (local_64 != 0) goto LAB_002106bc;
          bVar1 = true;
          text_begin = pcVar7;
          fVar9 = fStack_44;
        }
        else {
          pcVar7 = text_begin + 1;
LAB_002106bc:
          uVar5 = (ulong)local_64;
          fVar9 = fStack_44;
          if (uVar5 < 0x20) {
            if (uVar5 == 0xd) {
              bVar1 = false;
              text_begin = pcVar7;
            }
            else {
              if (local_64 != 10) goto LAB_00210703;
              uStack_40 = uStack_54 & (uint)fStack_44;
              local_48 = (float)(~-(uint)(local_58 <= local_48) & (uint)local_58 |
                                -(uint)(local_58 <= local_48) & (uint)local_48);
              uStack_54 = 0;
              uStack_50 = 0;
              uStack_4c = 0;
              bVar1 = false;
              text_begin = pcVar7;
              fVar9 = fStack_44 + size;
              fStack_3c = fStack_44;
              local_58 = 0.0;
            }
          }
          else {
LAB_00210703:
            pfVar6 = (this->IndexAdvanceX).Data + uVar5;
            if ((this->IndexAdvanceX).Size <= (int)local_64) {
              pfVar6 = &this->FallbackAdvanceX;
            }
            fVar8 = *pfVar6 * local_60 + local_58;
            bVar1 = local_5c <= fVar8;
            if (!bVar1) {
              uStack_54 = 0;
              uStack_50 = 0;
              uStack_4c = 0;
              text_begin = pcVar7;
              local_58 = fVar8;
            }
          }
        }
        if (bVar1) break;
      }
      else {
        if (pcVar4 == (char *)0x0) {
          pcVar4 = CalcWordWrapPositionA(this,local_60,text_begin,text_end,wrap_width - local_58);
        }
        if (text_begin < pcVar4) goto LAB_0021066b;
        if (local_48 < local_58) {
          local_48 = local_58;
        }
        fVar9 = fStack_44 + size;
        do {
          if ((*text_begin != ' ') && (pcVar4 = text_begin, *text_begin != '\t')) break;
          text_begin = text_begin + 1;
          pcVar4 = text_end;
        } while (text_begin != text_end);
        text_begin = pcVar4 + (*pcVar4 == '\n');
        local_58 = 0.0;
        uStack_54 = 0;
        uStack_50 = 0;
        uStack_4c = 0;
        pcVar4 = (char *)0x0;
      }
      fStack_44 = fVar9;
    } while (text_begin < text_end);
  }
  else {
    local_58 = 0.0;
    local_48 = 0.0;
    fVar9 = 0.0;
  }
  if (local_38 != (char **)0x0) {
    *local_38 = text_begin;
  }
  if (local_48 < local_58) {
    local_48 = local_58;
  }
  if (fVar9 == 0.0 || 0.0 < local_58) {
    fVar9 = fVar9 + size;
  }
  IVar10.y = fVar9;
  IVar10.x = local_48;
  return IVar10;
}

Assistant:

ImVec2 ImFont::CalcTextSizeA(float size, float max_width, float wrap_width, const char* text_begin, const char* text_end, const char** remaining) const
{
    if (!text_end)
        text_end = text_begin + strlen(text_begin); // FIXME-OPT: Need to avoid this.

    const float line_height = size;
    const float scale = size / FontSize;

    ImVec2 text_size = ImVec2(0, 0);
    float line_width = 0.0f;

    const bool word_wrap_enabled = (wrap_width > 0.0f);
    const char* word_wrap_eol = NULL;

    const char* s = text_begin;
    while (s < text_end)
    {
        if (word_wrap_enabled)
        {
            // Calculate how far we can render. Requires two passes on the string data but keeps the code simple and not intrusive for what's essentially an uncommon feature.
            if (!word_wrap_eol)
                word_wrap_eol = CalcWordWrapPositionA(scale, s, text_end, wrap_width - line_width);

            if (s >= word_wrap_eol)
            {
                if (text_size.x < line_width)
                    text_size.x = line_width;
                text_size.y += line_height;
                line_width = 0.0f;
                word_wrap_eol = NULL;
                s = CalcWordWrapNextLineStartA(s, text_end); // Wrapping skips upcoming blanks
                continue;
            }
        }

        // Decode and advance source
        const char* prev_s = s;
        unsigned int c = (unsigned int)*s;
        if (c < 0x80)
        {
            s += 1;
        }
        else
        {
            s += ImTextCharFromUtf8(&c, s, text_end);
            if (c == 0) // Malformed UTF-8?
                break;
        }

        if (c < 32)
        {
            if (c == '\n')
            {
                text_size.x = ImMax(text_size.x, line_width);
                text_size.y += line_height;
                line_width = 0.0f;
                continue;
            }
            if (c == '\r')
                continue;
        }

        const float char_width = ((int)c < IndexAdvanceX.Size ? IndexAdvanceX.Data[c] : FallbackAdvanceX) * scale;
        if (line_width + char_width >= max_width)
        {
            s = prev_s;
            break;
        }

        line_width += char_width;
    }

    if (text_size.x < line_width)
        text_size.x = line_width;

    if (line_width > 0 || text_size.y == 0.0f)
        text_size.y += line_height;

    if (remaining)
        *remaining = s;

    return text_size;
}